

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O1

size_t rtosc_bundle_elements(char *buffer,size_t len)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  uint *puVar4;
  
  if (len < 0x11) {
    return 0;
  }
  puVar4 = (uint *)(buffer + 0x10);
  sVar3 = 0;
  while( true ) {
    uVar1 = *puVar4;
    uVar2 = (uVar1 & 0xff0000) >> 8;
    if (((uVar1 >> 0x18 == 0 && uVar2 == 0) && (uVar1 & 0xff00) == 0) && uVar1 << 0x18 == 0) {
      return sVar3;
    }
    puVar4 = (uint *)((long)puVar4 +
                     (ulong)(uVar1 >> 0x18 & 0xfffffffc | uVar2 | (uVar1 & 0xff00) << 8 |
                            uVar1 << 0x18) + 4);
    if (len < (ulong)((long)puVar4 - (long)buffer)) break;
    sVar3 = sVar3 + 1;
    if (len <= (ulong)((long)puVar4 - (long)buffer)) {
      return sVar3;
    }
  }
  return sVar3;
}

Assistant:

size_t rtosc_bundle_elements(const char *buffer, size_t len)
{
    const uint32_t *lengths = (const uint32_t*) (buffer+16);
    size_t elms = 0;
    while(POS < len && extract_uint32((const uint8_t*)lengths)) {
        lengths += extract_uint32((const uint8_t*)lengths)/4+1;

        if(POS > len)
            break;
        ++elms;
    }
    return elms;
}